

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O2

string * __thiscall
cli::Parser::howto_required_abi_cxx11_(string *__return_storage_ptr__,Parser *this,CmdBase *command)

{
  ostream *poVar1;
  stringstream ss;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_198,"The parameter ");
  poVar1 = std::operator<<(poVar1,(string *)&command->name);
  std::operator<<(poVar1," is required.\n");
  poVar1 = std::operator<<(local_198,(string *)&command->description);
  std::operator<<(poVar1,'\n');
  print_help(this,&ss);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string howto_required(CmdBase* command) const {
			std::stringstream ss { };
			ss << "The parameter " << command->name << " is required.\n";
			ss << command->description << '\n';
			print_help(ss);
			return ss.str();
		}